

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void spvtools::Logf<spv::Op_const&>
               (MessageConsumer *consumer,spv_message_level_t level,char *source,
               spv_position_t *position,char *format,Op *args)

{
  uint uVar1;
  char *pcVar2;
  size_type __maxlen;
  allocator_type local_159;
  undefined1 local_158 [8];
  vector<char,_std::allocator<char>_> longer_message;
  char local_138 [4];
  int size;
  char message [256];
  Op *args_local;
  char *format_local;
  spv_position_t *position_local;
  char *source_local;
  spv_message_level_t level_local;
  MessageConsumer *consumer_local;
  
  message._248_8_ = args;
  longer_message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
       snprintf(local_138,0x100,format,(ulong)*args);
  if (((int)longer_message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ < 0) ||
     (0xff < (int)longer_message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_)) {
    if ((int)longer_message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ < 0) {
      Log(consumer,level,source,position,"cannot compose log message");
    }
    else {
      uVar1 = longer_message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_158,(ulong)uVar1,&local_159);
      std::allocator<char>::~allocator(&local_159);
      pcVar2 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_158);
      __maxlen = std::vector<char,_std::allocator<char>_>::size
                           ((vector<char,_std::allocator<char>_> *)local_158);
      snprintf(pcVar2,__maxlen,format,(ulong)*(uint *)message._248_8_);
      pcVar2 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)local_158);
      Log(consumer,level,source,position,pcVar2);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_158);
    }
  }
  else {
    Log(consumer,level,source,position,local_138);
  }
  return;
}

Assistant:

void Logf(const MessageConsumer& consumer, spv_message_level_t level,
          const char* source, const spv_position_t& position,
          const char* format, Args&&... args) {
#if defined(_MSC_VER) && _MSC_VER < 1900
// Sadly, snprintf() is not supported until Visual Studio 2015!
#define snprintf _snprintf
#endif

  enum { kInitBufferSize = 256 };

  char message[kInitBufferSize];
  const int size =
      snprintf(message, kInitBufferSize, format, std::forward<Args>(args)...);

  if (size >= 0 && size < kInitBufferSize) {
    Log(consumer, level, source, position, message);
    return;
  }

  if (size >= 0) {
    // The initial buffer is insufficient.  Allocate a buffer of a larger size,
    // and write to it instead.  Force the size to be unsigned to avoid a
    // warning in GCC 7.1.
    std::vector<char> longer_message(size + 1u);
    snprintf(longer_message.data(), longer_message.size(), format,
             std::forward<Args>(args)...);
    Log(consumer, level, source, position, longer_message.data());
    return;
  }

  Log(consumer, level, source, position, "cannot compose log message");

#if defined(_MSC_VER) && _MSC_VER < 1900
#undef snprintf
#endif
}